

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O0

void dynamic_api_suite::api_clear(void)

{
  pair<int,_int> *local_80;
  undefined4 local_74;
  size_type local_70;
  undefined4 local_64;
  size_type local_60 [2];
  int local_50 [2];
  value_type local_48;
  undefined1 local_40 [8];
  map_view<int,_int,_18446744073709551615UL,_std::less<int>_> span;
  pair<int,_int> array [4];
  
  local_80 = (pair<int,_int> *)&span.member;
  do {
    memset(local_80,0,8);
    vista::pair<int,_int>::pair(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != array + 3);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::map_view<4UL,_0>
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,
             (value_type (*) [4])&span.member);
  local_50[1] = 0xb;
  local_50[0] = 1;
  vista::pair<int,_int>::pair<int,_int,_0>(&local_48,local_50 + 1,local_50);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::insert
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40,local_48);
  local_60[0] = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                          ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x56,"void dynamic_api_suite::api_clear()",local_60,&local_64);
  vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::clear
            ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  local_70 = vista::map_view<int,_int,_18446744073709551615UL,_std::less<int>_>::size
                       ((map_view<int,_int,_18446744073709551615UL,_std::less<int>_> *)local_40);
  local_74 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0x58,"void dynamic_api_suite::api_clear()",&local_70,&local_74);
  return;
}

Assistant:

void api_clear()
{
    pair<int, int> array[4] = {};
    map_view<int, int> span(array);
    span.insert({ 11, 1 });
    BOOST_TEST_EQ(span.size(), 1);
    span.clear();
    BOOST_TEST_EQ(span.size(), 0);
}